

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O2

Ivy_Obj_t *
Ivy_ObjCreateGhost(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1,Ivy_Type_t Type,Ivy_Init_t Init)

{
  int *piVar1;
  int iVar2;
  
  if ((Type == IVY_AND) && (*(int *)((ulong)p0 & 0xfffffffffffffffe) == 0)) {
    __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                  ,0x137,
                  "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                 );
  }
  if (p1 == (Ivy_Obj_t *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)((ulong)p1 & 0xfffffffffffffffe);
    if (*piVar1 == 0) {
      __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                    ,0x138,
                    "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                   );
    }
  }
  if ((int *)((ulong)p0 & 0xfffffffffffffffe) != piVar1) {
    if (((ulong)p0 & 1) == 0 || Type != IVY_LATCH) {
      *(Ivy_Init_t *)&(p->Ghost).field_0x8 =
           (Init & IVY_INIT_DC) << 9 | Type & (IVY_VOID|IVY_BUF) |
           *(Ivy_Type_t *)&(p->Ghost).field_0x8 & 0xfffff9f0;
      (p->Ghost).pFanin0 = p0;
      (p->Ghost).pFanin1 = p1;
      if (p1 != (Ivy_Obj_t *)0x0) {
        if (p0 == (Ivy_Obj_t *)0x0) {
          iVar2 = 0;
        }
        else {
          iVar2 = *(int *)((ulong)p0 & 0xfffffffffffffffe);
        }
        if (*piVar1 < iVar2) {
          (p->Ghost).pFanin0 = p1;
          (p->Ghost).pFanin1 = p0;
        }
      }
      return &p->Ghost;
    }
    __assert_fail("Type != IVY_LATCH || !Ivy_IsComplement(p0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                  ,0x13a,
                  "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                 );
  }
  __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                ,0x139,
                "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
               );
}

Assistant:

static inline Ivy_Obj_t *  Ivy_ObjCreateGhost( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1, Ivy_Type_t Type, Ivy_Init_t Init )    
{
    Ivy_Obj_t * pGhost, * pTemp;
    assert( Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0)) );
    assert( p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1)) );
    assert( Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1) );
    assert( Type != IVY_LATCH || !Ivy_IsComplement(p0) );
//    assert( p1 == NULL || (!Ivy_ObjIsLatch(Ivy_Regular(p0)) || !Ivy_ObjIsLatch(Ivy_Regular(p1))) );
    pGhost = Ivy_ManGhost(p);
    pGhost->Type = Type;
    pGhost->Init = Init;
    pGhost->pFanin0 = p0;
    pGhost->pFanin1 = p1;
    if ( p1 && Ivy_ObjFaninId0(pGhost) > Ivy_ObjFaninId1(pGhost) )
        pTemp = pGhost->pFanin0, pGhost->pFanin0 = pGhost->pFanin1, pGhost->pFanin1 = pTemp;
    return pGhost;
}